

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_folding_rules.cpp
# Opt level: O3

Constant *
spvtools::opt::anon_unknown_0::FoldFPBinaryOp
          (BinaryScalarFoldingRule *scalar_rule,uint32_t result_type_id,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *constants,IRContext *context)

{
  ConstantManager *__args_3;
  pointer ppCVar1;
  Constant *__args_2;
  bool bVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  undefined8 *puVar5;
  short sVar6;
  int iVar7;
  uint32_t uVar8;
  Type *__args;
  undefined4 extraout_var;
  Instruction *this;
  Constant *pCVar9;
  ulong uVar10;
  ulong uVar11;
  undefined8 *puVar12;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ids;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  results_components;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  local_88;
  Type *local_70;
  uint32_t local_64;
  BinaryScalarFoldingRule *local_60;
  undefined8 *local_58;
  undefined8 *puStack_50;
  long local_48;
  pointer local_40;
  pointer local_38;
  
  sVar6 = (short)context->valid_analyses_;
  local_60 = scalar_rule;
  if ((context->valid_analyses_ >> 0xe & 1) == 0) {
    IRContext::BuildConstantManager(context);
    sVar6 = (short)context->valid_analyses_;
  }
  __args_3 = (context->constant_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl;
  if (-1 < sVar6) {
    IRContext::BuildTypeManager(context);
  }
  __args = analysis::TypeManager::GetType
                     ((context->type_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                      _M_head_impl,result_type_id);
  iVar7 = (*__args->_vptr_Type[0xe])(__args);
  local_70 = (Type *)CONCAT44(extraout_var,iVar7);
  ppCVar1 = (constants->
            super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pCVar9 = *ppCVar1;
  if ((pCVar9 == (Constant *)0x0) || (__args_2 = ppCVar1[1], __args_2 == (Constant *)0x0)) {
    pCVar9 = (Constant *)0x0;
  }
  else {
    if (local_70 == (Type *)0x0) {
      pCVar9 = std::
               function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
               ::operator()(local_60,__args,pCVar9,__args_2,__args_3);
      return pCVar9;
    }
    local_58 = (undefined8 *)0x0;
    puStack_50 = (undefined8 *)0x0;
    local_48 = 0;
    analysis::Constant::GetVectorComponents(&local_88,pCVar9,__args_3);
    ppCVar4 = local_88.
              super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppCVar1 = local_88.
              super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_38 = local_88.
               super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    analysis::Constant::GetVectorComponents
              (&local_88,
               (constants->
               super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               )._M_impl.super__Vector_impl_data._M_start[1],__args_3);
    ppCVar3 = local_88.
              super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_40 = local_88.
               super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((long)ppCVar4 - (long)ppCVar1 == 0) {
      local_88.
      super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.
      super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.
      super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      uVar10 = 0;
      uVar11 = 1;
      do {
        local_88.
        super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)std::
                      function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
                      ::operator()(local_60,(Type *)local_70[1]._vptr_Type,
                                   (Constant *)((_func_int ***)ppCVar1)[uVar10],
                                   (Constant *)((_func_int ***)ppCVar3)[uVar10],__args_3);
        std::
        vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>
        ::emplace_back<spvtools::opt::analysis::Constant_const*>
                  ((vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>
                    *)&local_58,(Constant **)&local_88);
        puVar5 = puStack_50;
        if (local_58[uVar10] == 0) {
          pCVar9 = (Constant *)0x0;
          goto LAB_0053f14c;
        }
        bVar2 = uVar11 < (ulong)((long)ppCVar4 - (long)ppCVar1 >> 3);
        uVar10 = uVar11;
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (bVar2);
      local_88.
      super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.
      super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.
      super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (local_58 != puStack_50) {
        puVar12 = local_58;
        do {
          uVar8 = 0;
          this = analysis::ConstantManager::GetDefiningInstruction
                           (__args_3,(Constant *)*puVar12,0,(inst_iterator *)0x0);
          if (this->has_result_id_ == true) {
            uVar8 = Instruction::GetSingleWordOperand(this,(uint)this->has_type_id_);
          }
          local_64 = uVar8;
          if (local_88.
              super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_88.
              super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88,
                       (iterator)
                       local_88.
                       super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_64);
          }
          else {
            *(uint32_t *)
             local_88.
             super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
             ._M_impl.super__Vector_impl_data._M_finish = uVar8;
            local_88.
            super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)((long)local_88.
                                 super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish + 4);
          }
          puVar12 = puVar12 + 1;
        } while (puVar12 != puVar5);
      }
    }
    pCVar9 = analysis::ConstantManager::GetConstant
                       (__args_3,local_70,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88);
    if ((Constant *)
        local_88.
        super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (Constant *)0x0) {
      operator_delete(local_88.
                      super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.
                            super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.
                            super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_58 != (undefined8 *)0x0) {
LAB_0053f14c:
      operator_delete(local_58,local_48 - (long)local_58);
    }
    if ((Constant *)ppCVar3 != (Constant *)0x0) {
      operator_delete(ppCVar3,(long)local_40 - (long)ppCVar3);
    }
    if ((Constant *)ppCVar1 != (Constant *)0x0) {
      operator_delete(ppCVar1,(long)local_38 - (long)ppCVar1);
    }
  }
  return pCVar9;
}

Assistant:

const analysis::Constant* FoldFPBinaryOp(
    BinaryScalarFoldingRule scalar_rule, uint32_t result_type_id,
    const std::vector<const analysis::Constant*>& constants,
    IRContext* context) {
  analysis::ConstantManager* const_mgr = context->get_constant_mgr();
  analysis::TypeManager* type_mgr = context->get_type_mgr();
  const analysis::Type* result_type = type_mgr->GetType(result_type_id);
  const analysis::Vector* vector_type = result_type->AsVector();

  if (constants[0] == nullptr || constants[1] == nullptr) {
    return nullptr;
  }

  if (vector_type != nullptr) {
    std::vector<const analysis::Constant*> a_components;
    std::vector<const analysis::Constant*> b_components;
    std::vector<const analysis::Constant*> results_components;

    a_components = constants[0]->GetVectorComponents(const_mgr);
    b_components = constants[1]->GetVectorComponents(const_mgr);

    // Fold each component of the vector.
    for (uint32_t i = 0; i < a_components.size(); ++i) {
      results_components.push_back(scalar_rule(vector_type->element_type(),
                                               a_components[i], b_components[i],
                                               const_mgr));
      if (results_components[i] == nullptr) {
        return nullptr;
      }
    }

    // Build the constant object and return it.
    std::vector<uint32_t> ids;
    for (const analysis::Constant* member : results_components) {
      ids.push_back(const_mgr->GetDefiningInstruction(member)->result_id());
    }
    return const_mgr->GetConstant(vector_type, ids);
  } else {
    return scalar_rule(result_type, constants[0], constants[1], const_mgr);
  }
}